

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>::
find<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Entry,capnp::Type&>
          (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks> *this,
          ArrayPtr<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> table,
          Type *params)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar7;
  HandlerBase *pHVar8;
  Entry *pEVar9;
  Type *in_R8;
  ulong uVar10;
  Maybe<unsigned_long> MVar11;
  
  pEVar9 = table.ptr;
  lVar1._0_2_ = pEVar9[1].key.baseType;
  lVar1._2_1_ = pEVar9[1].key.listDepth;
  lVar1._3_1_ = pEVar9[1].key.isImplicitParam;
  lVar1._4_2_ = pEVar9[1].key.field_3;
  lVar1._6_2_ = *(undefined2 *)&pEVar9[1].key.field_0x6;
  if (lVar1 == 0) {
    *this = (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>)0x0;
    aVar7.value = table.size_;
  }
  else {
    uVar4 = capnp::Type::hashCode(in_R8);
    uVar5._0_2_ = pEVar9[1].key.baseType;
    uVar5._2_1_ = pEVar9[1].key.listDepth;
    uVar5._3_1_ = pEVar9[1].key.isImplicitParam;
    uVar5 = kj::_::chooseBucket((uint)(uVar4 != 0),uVar5);
    uVar10 = (ulong)uVar5;
    iVar6 = *(int *)((long)&pEVar9->value[uVar10]._vptr_HandlerBase + 4);
    aVar7 = extraout_RDX;
    if (iVar6 != 0) {
      pHVar8 = pEVar9->value + uVar10;
      do {
        if (((iVar6 != 1) && (*(uint *)&pHVar8->_vptr_HandlerBase == (uint)(uVar4 != 0))) &&
           (bVar3 = capnp::Type::operator==((Type *)(table.size_ + (ulong)(iVar6 - 2) * 0x18),in_R8)
           , aVar7 = extraout_RDX_00, bVar3)) {
          iVar6 = *(int *)((long)&pHVar8->_vptr_HandlerBase + 4);
          *this = (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>)0x1
          ;
          *(ulong *)(this + 8) = (ulong)(iVar6 - 2);
          goto LAB_003a2de9;
        }
        uVar2._0_2_ = pEVar9[1].key.baseType;
        uVar2._2_1_ = pEVar9[1].key.listDepth;
        uVar2._3_1_ = pEVar9[1].key.isImplicitParam;
        uVar2._4_2_ = pEVar9[1].key.field_3;
        uVar2._6_2_ = *(undefined2 *)&pEVar9[1].key.field_0x6;
        if (uVar10 + 1 == uVar2) {
          uVar10 = 0;
        }
        else {
          uVar10 = uVar10 + 1 & 0xffffffff;
        }
        pHVar8 = pEVar9->value + uVar10;
        iVar6 = *(int *)((long)&pHVar8->_vptr_HandlerBase + 4);
      } while (iVar6 != 0);
    }
    *this = (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>)0x0;
  }
LAB_003a2de9:
  MVar11.ptr.field_1.value = aVar7.value;
  MVar11.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar11.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }